

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O0

CURLcode auth_decode_digest_md5_message
                   (bufref *chlgref,char *nonce,size_t nlen,char *realm,size_t rlen,char *alg,
                   size_t alen,char *qop,size_t qlen)

{
  _Bool _Var1;
  uchar *chlg_00;
  size_t sVar2;
  char *chlg;
  char *alg_local;
  size_t rlen_local;
  char *realm_local;
  size_t nlen_local;
  char *nonce_local;
  bufref *chlgref_local;
  
  chlg_00 = Curl_bufref_ptr(chlgref);
  sVar2 = Curl_bufref_len(chlgref);
  if (sVar2 == 0) {
    chlgref_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
  }
  else {
    _Var1 = auth_digest_get_key_value((char *)chlg_00,"nonce=\"",nonce,nlen,'\"');
    if (_Var1) {
      _Var1 = auth_digest_get_key_value((char *)chlg_00,"realm=\"",realm,rlen,'\"');
      if (!_Var1) {
        *realm = '\0';
      }
      _Var1 = auth_digest_get_key_value((char *)chlg_00,"algorithm=",alg,alen,',');
      if (_Var1) {
        _Var1 = auth_digest_get_key_value((char *)chlg_00,"qop=\"",qop,qlen,'\"');
        if (_Var1) {
          chlgref_local._4_4_ = CURLE_OK;
        }
        else {
          chlgref_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
        }
      }
      else {
        chlgref_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
      }
    }
    else {
      chlgref_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
    }
  }
  return chlgref_local._4_4_;
}

Assistant:

static CURLcode auth_decode_digest_md5_message(const struct bufref *chlgref,
                                               char *nonce, size_t nlen,
                                               char *realm, size_t rlen,
                                               char *alg, size_t alen,
                                               char *qop, size_t qlen)
{
  const char *chlg = (const char *) Curl_bufref_ptr(chlgref);

  /* Ensure we have a valid challenge message */
  if(!Curl_bufref_len(chlgref))
    return CURLE_BAD_CONTENT_ENCODING;

  /* Retrieve nonce string from the challenge */
  if(!auth_digest_get_key_value(chlg, "nonce=\"", nonce, nlen, '\"'))
    return CURLE_BAD_CONTENT_ENCODING;

  /* Retrieve realm string from the challenge */
  if(!auth_digest_get_key_value(chlg, "realm=\"", realm, rlen, '\"')) {
    /* Challenge does not have a realm, set empty string [RFC2831] page 6 */
    *realm = '\0';
  }

  /* Retrieve algorithm string from the challenge */
  if(!auth_digest_get_key_value(chlg, "algorithm=", alg, alen, ','))
    return CURLE_BAD_CONTENT_ENCODING;

  /* Retrieve qop-options string from the challenge */
  if(!auth_digest_get_key_value(chlg, "qop=\"", qop, qlen, '\"'))
    return CURLE_BAD_CONTENT_ENCODING;

  return CURLE_OK;
}